

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool Json::containsNewLine(Location begin,Location end)

{
  Location end_local;
  Location begin_local;
  
  end_local = begin;
  while( true ) {
    if (end <= end_local) {
      return false;
    }
    if ((*end_local == '\n') || (*end_local == '\r')) break;
    end_local = end_local + 1;
  }
  return true;
}

Assistant:

static bool containsNewLine(Reader::Location begin, Reader::Location end) {
  for (; begin < end; ++begin)
    if (*begin == '\n' || *begin == '\r')
      return true;
  return false;
}